

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.cpp
# Opt level: O0

PolyNf * __thiscall
Kernel::RenderPolyNf::operator()
          (RenderPolyNf *this,PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_> *facs)

{
  Monom *in_RDX;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_RSI;
  PolyNf *in_RDI;
  PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_00000060;
  RenderMonom *in_stack_00000068;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> poly;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffff28;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *this_00;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffff90;
  RenderPolyNf *in_stack_ffffffffffffff98;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_38;
  
  RenderMonom::operator()(in_stack_00000068,in_stack_00000060);
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Polynom(in_RSI,in_RDX);
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Monom
            ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x92a93b);
  this_00 = &local_38;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::integrity(this_00);
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Polynom
            (this_00,in_stack_ffffffffffffff28);
  operator()(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x92a981);
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x92a98e);
  return in_RDI;
}

Assistant:

PolyNf operator()(PreMonom<NumTraits> facs) const
  {
    auto poly = Polynom<NumTraits>(RenderMonom{}(std::move(facs)));
    poly.integrity();
    return (*this)(std::move(poly));
  }